

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O2

void __thiscall TestChain100Setup::mineBlocks(TestChain100Setup *this,int num_blocks)

{
  CScript *this_00;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  int64_t iVar1;
  long in_FS_OFFSET;
  bool bVar2;
  span<const_std::byte,_18446744073709551615UL> b_00;
  CBlock b;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> noTxns;
  CScript scriptPubKey;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_100;
  CBlock local_e8;
  undefined1 local_78 [32];
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._16_8_ = 0;
  local_78._24_8_ = 0;
  local_78._0_8_ = (char *)0x0;
  local_78._8_8_ = 0;
  CKey::GetPubKey((CPubKey *)&local_e8,&this->coinbaseKey);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_100,
             (CPubKey *)&local_e8);
  b_00._M_extent._M_extent_value =
       (long)local_100._M_impl.super__Vector_impl_data._M_finish -
       (long)local_100._M_impl.super__Vector_impl_data._M_start;
  b_00._M_ptr = local_100._M_impl.super__Vector_impl_data._M_start;
  this_00 = CScript::operator<<((CScript *)local_78,b_00);
  other = &CScript::operator<<(this_00,OP_CHECKSIG)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector(&local_58,other);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_100);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78);
  if (num_blocks < 1) {
    num_blocks = 0;
  }
  while (bVar2 = num_blocks != 0, num_blocks = num_blocks + -1, bVar2) {
    local_78._0_8_ = (char *)0x0;
    local_78._8_8_ = 0;
    local_78._16_8_ = 0;
    CreateAndProcessBlock
              (&local_e8,this,
               (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)local_78,
               (CScript *)&local_58,(Chainstate *)0x0);
    iVar1 = GetTime();
    SetMockTime(iVar1 + 1);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::push_back(&this->m_coinbase_txns,
                local_e8.vtx.
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_start);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(&local_e8.vtx);
    std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
              ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)local_78);
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestChain100Setup::mineBlocks(int num_blocks)
{
    CScript scriptPubKey = CScript() << ToByteVector(coinbaseKey.GetPubKey()) << OP_CHECKSIG;
    for (int i = 0; i < num_blocks; i++) {
        std::vector<CMutableTransaction> noTxns;
        CBlock b = CreateAndProcessBlock(noTxns, scriptPubKey);
        SetMockTime(GetTime() + 1);
        m_coinbase_txns.push_back(b.vtx[0]);
    }
}